

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O0

void updateSceneGraph(aiNode *pNode,uint index)

{
  uint local_20;
  uint local_1c;
  uint i_1;
  uint j;
  uint i;
  uint index_local;
  aiNode *pNode_local;
  
  for (i_1 = 0; i_1 < pNode->mNumMeshes; i_1 = i_1 + 1) {
    if (index < pNode->mMeshes[i_1]) {
      pNode->mMeshes[i_1] = pNode->mMeshes[i_1] - 1;
    }
    else if (pNode->mMeshes[i_1] == index) {
      for (local_1c = i_1; local_1c < pNode->mNumMeshes - 1; local_1c = local_1c + 1) {
        pNode->mMeshes[local_1c] = pNode->mMeshes[local_1c + 1];
      }
      pNode->mNumMeshes = pNode->mNumMeshes - 1;
      i_1 = i_1 - 1;
    }
  }
  for (local_20 = 0; local_20 < pNode->mNumChildren; local_20 = local_20 + 1) {
    updateSceneGraph(pNode->mChildren[local_20],index);
  }
  return;
}

Assistant:

static void updateSceneGraph(aiNode* pNode, unsigned const index) {
    for (unsigned i = 0; i < pNode->mNumMeshes; ++i) {
        if (pNode->mMeshes[i] > index) {
            --(pNode->mMeshes[i]);
            continue;
        }
        if (pNode->mMeshes[i] == index) {
            for (unsigned j = i; j < pNode->mNumMeshes -1; ++j) {
                pNode->mMeshes[j] = pNode->mMeshes[j+1];
            }
            --(pNode->mNumMeshes);
            --i;
            continue;
        }
    }
    //recurse to all children
    for (unsigned i = 0; i < pNode->mNumChildren; ++i) {
        updateSceneGraph(pNode->mChildren[i], index);
    }
}